

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetlinecontrol.cpp
# Opt level: O0

int __thiscall QWidgetLineControl::init(QWidgetLineControl *this,EVP_PKEY_CTX *ctx)

{
  undefined4 uVar1;
  qsizetype qVar2;
  QPlatformTheme *pQVar3;
  long in_FS_OFFSET;
  QPlatformTheme *theme;
  bool local_48 [23];
  undefined1 in_stack_ffffffffffffffcf;
  QWidgetLineControl *in_stack_ffffffffffffffd0;
  QVariant local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QTextLayout::setCacheEnabled((bool)((char)this + '\x18'));
  QString::operator=((QString *)(this + 0x18),(QString *)ctx);
  updateDisplayText(in_stack_ffffffffffffffd0,(bool)in_stack_ffffffffffffffcf);
  qVar2 = QString::size((QString *)(this + 0x18));
  *(int *)(this + 0x40) = (int)qVar2;
  pQVar3 = QGuiApplicationPrivate::platformTheme();
  if (pQVar3 != (QPlatformTheme *)0x0) {
    (**(code **)(*(long *)pQVar3 + 0x60))(&local_28,pQVar3,0x16);
    uVar1 = ::QVariant::toInt((bool *)&local_28);
    *(undefined4 *)(this + 300) = uVar1;
    ::QVariant::~QVariant(&local_28);
    (**(code **)(*(long *)pQVar3 + 0x60))(local_48,pQVar3,6);
    uVar1 = ::QVariant::toInt(local_48);
    *(undefined4 *)(this + 0x128) = uVar1;
    ::QVariant::~QVariant((QVariant *)local_48);
  }
  if (((*(int *)(this + 300) == 3) || (*(int *)(this + 300) == 4)) || (*(int *)(this + 300) == 5)) {
    *(undefined4 *)(this + 300) = 2;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (int)*(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void QWidgetLineControl::init(const QString &txt)
{
    m_textLayout.setCacheEnabled(true);
    m_text = txt;
    updateDisplayText();
    m_cursor = m_text.size();
    if (const QPlatformTheme *theme = QGuiApplicationPrivate::platformTheme()) {
        m_keyboardScheme = theme->themeHint(QPlatformTheme::KeyboardScheme).toInt();
        m_passwordMaskDelay = theme->themeHint(QPlatformTheme::PasswordMaskDelay).toInt();
    }
    // Generalize for X11
    if (m_keyboardScheme == QPlatformTheme::KdeKeyboardScheme
        || m_keyboardScheme == QPlatformTheme::GnomeKeyboardScheme
        || m_keyboardScheme == QPlatformTheme::CdeKeyboardScheme) {
        m_keyboardScheme = QPlatformTheme::X11KeyboardScheme;
    }
}